

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O3

void __thiscall
CEException::sofa_error::sofa_error
          (sofa_error *this,string *origin,string *sofa_method,int *errcode,string *message)

{
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"SOFA error",(allocator *)&local_d0);
  CEExceptionHandler::CEExceptionHandler(&this->super_CEExceptionHandler,origin,message,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_d0);
  *(undefined ***)&this->super_CEExceptionHandler = &PTR__CEExceptionHandler_00165960;
  std::operator+(&local_90,"SOFA method: ",sofa_method);
  std::operator+(&local_70,&local_90,", ErrCode: ");
  std::__cxx11::to_string(&local_b0,*errcode);
  std::operator+(&local_50,&local_70,&local_b0);
  std::operator+(&local_d0,&local_50,"\n");
  std::operator+(&local_f0,&local_d0,message);
  (**(code **)(*(long *)&this->super_CEExceptionHandler + 0x20))(this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

CEException::sofa_error::sofa_error(const std::string& origin,
                                    const std::string& sofa_method,
                                    const int&         errcode,
                                    const std::string& message) :
    CEExceptionHandler(origin, message, "SOFA error")
{
    // Overwrite the message
    this->message("SOFA method: " + sofa_method + ", ErrCode: "+ std::to_string(errcode) +
                  "\n" + message);
}